

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_data.cc
# Opt level: O0

string * GetTestData_abi_cxx11_(string *__return_storage_ptr__,char *path)

{
  bool bVar1;
  int iVar2;
  char *__filename;
  FILE *pFVar3;
  size_t sVar4;
  undefined8 uVar5;
  char *local_288;
  size_t n;
  char buf [512];
  unique_ptr<_IO_FILE,_bssl::FileDeleter> local_60;
  ScopedFILE file;
  allocator<char> local_41;
  string local_40 [8];
  string full_path;
  char *root;
  char *path_local;
  string *ret;
  
  local_288 = getenv("BORINGSSL_TEST_DATA_ROOT");
  if (local_288 == (char *)0x0) {
    local_288 = ".";
  }
  full_path.field_2._8_8_ = local_288;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,local_288,&local_41);
  std::allocator<char>::~allocator(&local_41);
  std::__cxx11::string::push_back((char)local_40);
  std::__cxx11::string::append((char *)local_40);
  __filename = (char *)std::__cxx11::string::c_str();
  pFVar3 = fopen(__filename,"rb");
  std::unique_ptr<_IO_FILE,bssl::FileDeleter>::unique_ptr<bssl::FileDeleter,void>
            ((unique_ptr<_IO_FILE,bssl::FileDeleter> *)&local_60,(pointer)pFVar3);
  bVar1 = std::operator==(&local_60,(nullptr_t)0x0);
  pFVar3 = _stderr;
  if (bVar1) {
    uVar5 = std::__cxx11::string::c_str();
    fprintf(pFVar3,"Could not open \'%s\'.\n",uVar5);
    abort();
  }
  buf[0x1ff] = '\0';
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  while( true ) {
    pFVar3 = (FILE *)std::unique_ptr<_IO_FILE,_bssl::FileDeleter>::get(&local_60);
    sVar4 = fread(&n,1,0x200,pFVar3);
    if (sVar4 == 0) break;
    std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)&n);
  }
  pFVar3 = (FILE *)std::unique_ptr<_IO_FILE,_bssl::FileDeleter>::get(&local_60);
  iVar2 = feof(pFVar3);
  pFVar3 = _stderr;
  if (iVar2 != 0) {
    buf[0x1ff] = '\x01';
    std::unique_ptr<_IO_FILE,_bssl::FileDeleter>::~unique_ptr(&local_60);
    std::__cxx11::string::~string(local_40);
    return __return_storage_ptr__;
  }
  uVar5 = std::__cxx11::string::c_str();
  fprintf(pFVar3,"Error reading from \'%s\'.\n",uVar5);
  abort();
}

Assistant:

std::string GetTestData(const char *path) {
#if defined(BORINGSSL_USE_BAZEL_RUNFILES)
  std::string error;
  std::unique_ptr<Runfiles> runfiles(
      Runfiles::CreateForTest(BAZEL_CURRENT_REPOSITORY, &error));
  if (runfiles == nullptr) {
    fprintf(stderr, "Could not initialize runfiles: %s\n", error.c_str());
    abort();
  }

  std::string full_path = runfiles->Rlocation(std::string("boringssl/") + path);
  if (full_path.empty()) {
    fprintf(stderr, "Could not find runfile '%s'.\n", path);
    abort();
  }
#else
  const char *root = getenv("BORINGSSL_TEST_DATA_ROOT");
  root = root != nullptr ? root : ".";

  std::string full_path = root;
  full_path.push_back('/');
  full_path.append(path);
#endif

  bssl::ScopedFILE file(fopen(full_path.c_str(), "rb"));
  if (file == nullptr) {
    fprintf(stderr, "Could not open '%s'.\n", full_path.c_str());
    abort();
  }

  std::string ret;
  for (;;) {
    char buf[512];
    size_t n = fread(buf, 1, sizeof(buf), file.get());
    if (n == 0) {
      if (feof(file.get())) {
        return ret;
      }
      fprintf(stderr, "Error reading from '%s'.\n", full_path.c_str());
      abort();
    }
    ret.append(buf, n);
  }
}